

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

NodeIterator __thiscall
DirectChainedMap<TypeFunction_*>::first(DirectChainedMap<TypeFunction_*> *this,uint hash)

{
  Node *pNVar1;
  long lVar2;
  Node *pNVar3;
  NodeIterator NVar4;
  
  lVar2 = (ulong)(this->bucketCount - 1 & hash) * 0x18;
  if (*(long *)(this->data + lVar2 + 0x10) != 0) {
    pNVar1 = this->data + lVar2;
    pNVar3 = pNVar1;
    do {
      if (pNVar3 == (Node *)0x0) break;
      if (*(uint *)pNVar3 == hash) goto LAB_0017de56;
      pNVar3 = *(Node **)(pNVar3 + 0x10);
    } while (pNVar3 != pNVar1);
  }
  pNVar1 = (Node *)0x0;
  pNVar3 = (Node *)0x0;
LAB_0017de56:
  NVar4.node = pNVar3;
  NVar4.start = pNVar1;
  return NVar4;
}

Assistant:

NodeIterator first(unsigned hash)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = hash & bucketMask;

		Node *start = &data[bucket];
		Node *curr = start;

		if(!curr->next)
			return NodeIterator();

		while(curr)
		{
			if(curr->hash == hash)
				return NodeIterator(start, curr);

			curr = curr->next;

			if(curr == start)
				return NodeIterator();
		}

		return NodeIterator();
	}